

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::Log(LogSeverity severity,string *message,int stack_frames_to_skip)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  reference pcVar5;
  UnitTest *pUVar6;
  UnitTest *pUVar7;
  int in_EDX;
  string *in_RSI;
  int in_EDI;
  int actual_to_skip;
  MutexLock l;
  MutexBase *in_stack_ffffffffffffff78;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  string local_58 [40];
  undefined4 local_30;
  int local_14;
  string *local_10;
  int local_4;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  bVar1 = LogIsVisible(0x16ca53);
  if (bVar1) {
    GTestMutexLock::GTestMutexLock
              ((GTestMutexLock *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (local_4 == 1) {
      std::operator<<((ostream *)&std::cout,"\nGMOCK WARNING:");
    }
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10), *pcVar4 != '\n')) {
      std::operator<<((ostream *)&std::cout,"\n");
    }
    std::operator<<((ostream *)&std::cout,local_10);
    if (-1 < local_14) {
      local_30 = 0;
      uVar2 = std::__cxx11::string::empty();
      bVar1 = false;
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::rbegin();
        pcVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_ffffffffffffff80);
        bVar1 = *pcVar5 != '\n';
      }
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,"\n");
      }
      pUVar6 = (UnitTest *)std::operator<<((ostream *)&std::cout,"Stack trace:\n");
      pUVar7 = UnitTest::GetInstance();
      GetCurrentOsStackTraceExceptTop_abi_cxx11_(pUVar6,(int)((ulong)pUVar7 >> 0x20));
      std::operator<<((ostream *)pUVar6,local_58);
      std::__cxx11::string::~string(local_58);
    }
    std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
    GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x16cc00);
  }
  return;
}

Assistant:

GTEST_API_ void Log(LogSeverity severity,
                    const string& message,
                    int stack_frames_to_skip) {
  if (!LogIsVisible(severity))
    return;

  // Ensures that logs from different threads don't interleave.
  MutexLock l(&g_log_mutex);

  // "using ::std::cout;" doesn't work with Symbian's STLport, where cout is a
  // macro.

  if (severity == kWarning) {
    // Prints a GMOCK WARNING marker to make the warnings easily searchable.
    std::cout << "\nGMOCK WARNING:";
  }
  // Pre-pends a new-line to message if it doesn't start with one.
  if (message.empty() || message[0] != '\n') {
    std::cout << "\n";
  }
  std::cout << message;
  if (stack_frames_to_skip >= 0) {
#ifdef NDEBUG
    // In opt mode, we have to be conservative and skip no stack frame.
    const int actual_to_skip = 0;
#else
    // In dbg mode, we can do what the caller tell us to do (plus one
    // for skipping this function's stack frame).
    const int actual_to_skip = stack_frames_to_skip + 1;
#endif  // NDEBUG

    // Appends a new-line to message if it doesn't end with one.
    if (!message.empty() && *message.rbegin() != '\n') {
      std::cout << "\n";
    }
    std::cout << "Stack trace:\n"
         << ::testing::internal::GetCurrentOsStackTraceExceptTop(
             ::testing::UnitTest::GetInstance(), actual_to_skip);
  }
  std::cout << ::std::flush;
}